

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O3

void __thiscall
ObjectFile::ObjectFile
          (ObjectFile *this,OSToken *parent,string *inPath,int inUmask,string *inLockpath,bool isNew
          )

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  Generation *pGVar3;
  MutexFactory *this_00;
  Mutex *pMVar4;
  string local_50;
  
  (this->super_OSObject)._vptr_OSObject = (_func_int **)&PTR__ObjectFile_0019da50;
  (this->path)._M_dataplus._M_p = (pointer)&(this->path).field_2;
  (this->path)._M_string_length = 0;
  (this->path).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->attributes)._M_t._M_impl.super__Rb_tree_header;
  (this->attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->attributes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->lockpath)._M_dataplus._M_p = (pointer)&(this->lockpath).field_2;
  (this->lockpath)._M_string_length = 0;
  (this->lockpath).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->path);
  this->umask = inUmask;
  pcVar2 = (this->path)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + (this->path)._M_string_length);
  pGVar3 = Generation::create(&local_50,this->umask,false);
  this->gen = pGVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  this_00 = MutexFactory::i();
  pMVar4 = MutexFactory::getMutex(this_00);
  this->objectMutex = pMVar4;
  this->valid = pMVar4 != (Mutex *)0x0 && this->gen != (Generation *)0x0;
  this->token = parent;
  this->inTransaction = false;
  this->transactionLockFile = (File *)0x0;
  std::__cxx11::string::_M_assign((string *)&this->lockpath);
  if (this->valid != false) {
    pcVar2 = (this->path)._M_dataplus._M_p;
    if (isNew) {
      softHSMLog(7,"ObjectFile",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                 ,0x4a,"Created new object %s",pcVar2);
      store(this,false);
    }
    else {
      softHSMLog(7,"ObjectFile",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                 ,0x44,"Opened existing object %s",pcVar2);
      refresh(this,true);
    }
  }
  return;
}

Assistant:

ObjectFile::ObjectFile(OSToken* parent, std::string inPath, int inUmask, std::string inLockpath, bool isNew /* = false */)
{
	path = inPath;
	umask = inUmask;
	gen = Generation::create(path, umask, false);
	objectMutex = MutexFactory::i()->getMutex();
	valid = (gen != NULL) && (objectMutex != NULL);
	token = parent;
	inTransaction = false;
	transactionLockFile = NULL;
	lockpath = inLockpath;

	if (!valid) return;

	if (!isNew)
	{
		DEBUG_MSG("Opened existing object %s", path.c_str());

		refresh(true);
	}
	else
	{
		DEBUG_MSG("Created new object %s", path.c_str());

		// Create an empty object file
		store();
	}

}